

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O1

void __thiscall
TxOutReference_GetSerializeSize_Test::TestBody(TxOutReference_GetSerializeSize_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  AssertionResult gtest_ar;
  TxOutReference txout_ref;
  TxOut txout;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  AssertHelper local_c0;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined1 local_a8 [24];
  Script local_90;
  TxOut local_58;
  
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  local_a8._0_8_ = AVar2.amount_;
  local_a8[8] = AVar2.ignore_check_;
  cfd::core::TxOut::TxOut(&local_58,(Amount *)local_a8,&exp_script);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_a8,&local_58);
  local_c8.ptr_._0_4_ =
       cfd::core::AbstractTxOutReference::GetSerializeSize((AbstractTxOutReference *)local_a8);
  local_c0.data_._0_4_ = 0x22;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_b8,"txout_ref.GetSerializeSize()","34",(uint *)&local_c8,(int *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = &PTR__AbstractTxOutReference_00693fb8;
  cfd::core::Script::~Script(&local_90);
  local_58.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_006a6570;
  cfd::core::Script::~Script(&local_58.super_AbstractTxOut.locking_script_);
  return;
}

Assistant:

TEST(TxOutReference, GetSerializeSize) {
  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    TxOutReference txout_ref(txout);

    EXPECT_EQ(txout_ref.GetSerializeSize(), 34);
  }
}